

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AtanId>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>
               *c,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  ptrdiff_t _Num;
  ulong uVar4;
  size_t sVar5;
  char *str;
  
  pcVar3 = (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  sVar2 = strlen(pcVar3);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + sVar2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  if (sVar2 != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,sVar2);
  }
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  pcVar3 = pBVar1->ptr_;
  sVar5 = pBVar1->size_;
  (pcVar3 + sVar5)[0] = ':';
  (pcVar3 + sVar5)[1] = ' ';
  pBVar1->size_ = uVar4;
  sVar5 = (size_t)(c->super_FunctionalConstraint).result_var_;
  if (-1 < (long)sVar5) {
    pcVar3 = ItemNamer::at(vnam,sVar5);
    sVar2 = strlen(pcVar3);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar4 = pBVar1->size_ + sVar2;
    if (pBVar1->capacity_ < uVar4) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    }
    if (sVar2 != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,sVar2);
    }
    pBVar1->size_ = uVar4;
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar4 = pBVar1->size_ + 4;
    if (pBVar1->capacity_ < uVar4) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    }
    builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," == ",4);
    pBVar1->size_ = uVar4;
  }
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<int,0ul>,mp::AtanId>
            (wrt,&c->
                  super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AtanId>
             ,vnam);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}